

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_buffer.cpp
# Opt level: O1

void __thiscall libtorrent::aux::receive_buffer::reset(receive_buffer *this,int packet_size)

{
  int iVar1;
  
  iVar1 = this->m_packet_size;
  if (iVar1 < this->m_recv_end) {
    this->m_recv_start = this->m_recv_start + iVar1;
    this->m_recv_pos = this->m_recv_pos - iVar1;
  }
  else {
    this->m_recv_pos = 0;
    this->m_recv_start = 0;
    this->m_recv_end = 0;
  }
  this->m_packet_size = packet_size;
  return;
}

Assistant:

void receive_buffer::reset(int const packet_size)
{
	INVARIANT_CHECK;
	TORRENT_ASSERT(int(m_recv_buffer.size()) >= m_recv_end);
	TORRENT_ASSERT(packet_size > 0);
	if (m_recv_end > m_packet_size)
	{
		cut(m_packet_size, packet_size);
		return;
	}

	m_recv_pos = 0;
	m_recv_start = 0;
	m_recv_end = 0;
	m_packet_size = packet_size;
}